

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQFailure<double,double>
          (internal *this,char *expected_expression,char *actual_expression,double *expected,
          double *actual)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_70;
  string local_50;
  internal *local_30;
  double *actual_local;
  double *expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  
  local_30 = (internal *)actual;
  actual_local = expected;
  expected_local = (double *)actual_expression;
  actual_expression_local = expected_expression;
  expected_expression_local = (char *)this;
  FormatForComparisonFailureMessage<double,double>(&local_50,(internal *)expected,actual,expected);
  FormatForComparisonFailureMessage<double,double>(&local_70,local_30,actual_local,expected);
  EqFailure(this,expected_expression,actual_expression,&local_50,&local_70,false);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* expected_expression,
                                   const char* actual_expression,
                                   const T1& expected, const T2& actual) {
  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}